

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O2

void Acb_TranslateCnf(Vec_Int_t *vClas,Vec_Int_t *vLits,Vec_Str_t *vCnf,Vec_Int_t *vSatVars,
                     int iPivotVar)

{
  int *piVar1;
  byte bVar2;
  uint uVar3;
  int c;
  int iVar4;
  int i;
  Vec_Int_t *p;
  
  i = 0;
  do {
    if (vCnf->nSize <= i) {
      return;
    }
    bVar2 = Vec_StrEntry(vCnf,i);
    if (bVar2 == 0xff) {
      uVar3 = vLits->nSize;
      p = vClas;
    }
    else {
      if ((char)bVar2 < '\0') {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x134,"int Abc_Lit2LitV(int *, int)");
      }
      piVar1 = vSatVars->pArray;
      uVar3 = Abc_Lit2Var((uint)bVar2);
      iVar4 = piVar1[uVar3];
      c = Abc_LitIsCompl((uint)bVar2);
      uVar3 = Abc_Var2Lit(iVar4,c);
      iVar4 = Abc_Lit2Var(uVar3);
      if ((int)uVar3 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar3 = uVar3 ^ iVar4 == iPivotVar;
      p = vLits;
    }
    Vec_IntPush(p,uVar3);
    i = i + 1;
  } while( true );
}

Assistant:

void Acb_TranslateCnf( Vec_Int_t * vClas, Vec_Int_t * vLits, Vec_Str_t * vCnf, Vec_Int_t * vSatVars, int iPivotVar )
{
    signed char Entry;
    int i, Lit;
    Vec_StrForEachEntry( vCnf, Entry, i )
    {
        if ( (int)Entry == -1 )
        {
            Vec_IntPush( vClas, Vec_IntSize(vLits) );
            continue;
        }
        Lit = Abc_Lit2LitV( Vec_IntArray(vSatVars), (int)Entry );
        Lit = Abc_LitNotCond( Lit, Abc_Lit2Var(Lit) == iPivotVar );
        Vec_IntPush( vLits, Lit );
    }
}